

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_transform_base.h
# Opt level: O2

int * __thiscall
draco::PredictionSchemeWrapTransformBase<int>::ClampPredictedValue
          (PredictionSchemeWrapTransformBase<int> *this,int *predicted_val)

{
  int iVar1;
  int *piVar2;
  int i;
  long lVar3;
  int iVar4;
  
  piVar2 = (this->clamped_value_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 < this->num_components_; lVar3 = lVar3 + 1) {
    iVar1 = predicted_val[lVar3];
    iVar4 = this->max_value_;
    if ((iVar4 < iVar1) || (iVar4 = this->min_value_, iVar1 < iVar4)) {
      piVar2[lVar3] = iVar4;
    }
    else {
      piVar2[lVar3] = iVar1;
    }
  }
  return piVar2;
}

Assistant:

inline const DataTypeT *ClampPredictedValue(
      const DataTypeT *predicted_val) const {
    for (int i = 0; i < this->num_components(); ++i) {
      if (predicted_val[i] > max_value_) {
        clamped_value_[i] = max_value_;
      } else if (predicted_val[i] < min_value_) {
        clamped_value_[i] = min_value_;
      } else {
        clamped_value_[i] = predicted_val[i];
      }
    }
    return clamped_value_.data();
  }